

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::ByteSizeLong
          (CategoricalDistributionLayerParams *this)

{
  bool bVar1;
  int iVar2;
  int64 iVar3;
  size_t sVar4;
  float fVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  CategoricalDistributionLayerParams *this_local;
  
  sStack_18 = 0;
  iVar3 = seed(this);
  if (iVar3 != 0) {
    iVar3 = seed(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int64Size(iVar3);
    sStack_18 = sStack_18 + 1;
  }
  iVar3 = numsamples(this);
  if (iVar3 != 0) {
    iVar3 = numsamples(this);
    sVar4 = google::protobuf::internal::WireFormatLite::Int64Size(iVar3);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  bVar1 = islogits(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  fVar5 = eps(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    sStack_18 = sStack_18 + 5;
  }
  fVar5 = temperature(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    sStack_18 = sStack_18 + 5;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t CategoricalDistributionLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CategoricalDistributionLayerParams)
  size_t total_size = 0;

  // int64 seed = 1;
  if (this->seed() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->seed());
  }

  // int64 numSamples = 2;
  if (this->numsamples() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->numsamples());
  }

  // bool isLogits = 3;
  if (this->islogits() != 0) {
    total_size += 1 + 1;
  }

  // float eps = 4;
  if (this->eps() != 0) {
    total_size += 1 + 4;
  }

  // float temperature = 5;
  if (this->temperature() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}